

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void NavRestoreLayer(ImGuiNavLayer layer)

{
  ImRect *pIVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  ImGuiWindow *window;
  
  pIVar3 = GImGui;
  GImGui->NavLayer = layer;
  window = pIVar3->NavWindow;
  if (layer == ImGuiNavLayer_Main) {
    window = ImGui::NavRestoreLastChildNavWindow(window);
    pIVar3->NavWindow = window;
  }
  pIVar3 = GImGui;
  if (window->NavLastIds[layer] != 0) {
    ImGui::SetNavID(window->NavLastIds[layer],layer,0);
    IVar2 = window->NavRectRel[layer].Max;
    pIVar1 = pIVar3->NavWindow->NavRectRel + (int)layer;
    pIVar1->Min = window->NavRectRel[layer].Min;
    pIVar1->Max = IVar2;
    pIVar3->NavMousePosDirty = true;
    pIVar3->NavDisableHighlight = false;
    pIVar3->NavDisableMouseHover = true;
    return;
  }
  ImGui::NavInitWindow(window,true);
  return;
}

Assistant:

static void NavRestoreLayer(ImGuiNavLayer layer)
{
    ImGuiContext& g = *GImGui;
    g.NavLayer = layer;
    if (layer == 0)
        g.NavWindow = ImGui::NavRestoreLastChildNavWindow(g.NavWindow);
    ImGuiWindow* window = g.NavWindow;
    if (window->NavLastIds[layer] != 0)
        ImGui::SetNavIDWithRectRel(window->NavLastIds[layer], layer, 0, g.NavWindow->NavRectRel[layer]);
    else
        ImGui::NavInitWindow(window, true);
}